

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

bool __thiscall
ON_ClassArray<ON_MappingRef>::HeapSort
          (ON_ClassArray<ON_MappingRef> *this,_func_int_ON_MappingRef_ptr_ON_MappingRef_ptr *compar)

{
  int iVar1;
  
  if (this->m_a != (ON_MappingRef *)0x0) {
    iVar1 = this->m_count;
    if (compar != (_func_int_ON_MappingRef_ptr_ON_MappingRef_ptr *)0x0 && 0 < (long)iVar1) {
      if (iVar1 < 2) {
        return true;
      }
      ON_hsort(this->m_a,(long)iVar1,0x28,(_func_int_void_ptr_void_ptr *)compar);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_ClassArray<T>::HeapSort( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar ) 
  {
    if ( m_count > 1 )
      ON_hsort( m_a, m_count, sizeof(T), (int(*)(const void*,const void*))compar );
    rc = true;
  }
  return rc;
}